

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFileSystem.cpp
# Opt level: O0

void __thiscall irr::io::CFileSystem::CFileSystem(CFileSystem *this)

{
  array<irr::io::IArchiveLoader_*> *this_00;
  IFileSystem *in_RDI;
  IFileSystem *in_stack_ffffffffffffffb8;
  array<irr::io::IArchiveLoader_*> *in_stack_ffffffffffffffc0;
  undefined1 *local_18;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[4].field_0x10);
  IFileSystem::IFileSystem(in_RDI,&PTR_construction_vtable_24__00441a08);
  in_RDI->_vptr_IFileSystem = (_func_int **)0x4418e8;
  *(undefined8 *)&in_RDI[4].field_0x10 = 0x4419f0;
  local_18 = &in_RDI->field_0x10;
  do {
    core::string<char>::string((string<char> *)0x3804b0);
    local_18 = local_18 + 0x20;
  } while (local_18 != &in_RDI[2].field_0x10);
  core::array<irr::io::IArchiveLoader_*>::array(in_stack_ffffffffffffffc0);
  core::array<irr::io::IFileArchive_*>::array
            ((array<irr::io::IFileArchive_*> *)in_stack_ffffffffffffffc0);
  (*in_RDI->_vptr_IFileSystem[0x1a])(in_RDI,0);
  (*in_RDI->_vptr_IFileSystem[0x11])();
  this_00 = (array<irr::io::IArchiveLoader_*> *)operator_new(0x28);
  CArchiveLoaderZIP::CArchiveLoaderZIP((CArchiveLoaderZIP *)this_00,in_stack_ffffffffffffffb8);
  core::array<irr::io::IArchiveLoader_*>::push_back
            (this_00,(IArchiveLoader **)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

CFileSystem::CFileSystem()
{
#ifdef _DEBUG
	setDebugName("CFileSystem");
#endif

	setFileListSystem(FILESYSTEM_NATIVE);
	//! reset current working directory
	getWorkingDirectory();

	ArchiveLoader.push_back(new CArchiveLoaderZIP(this));
}